

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  float *pfVar1;
  ImFontGlyph *pIVar2;
  int iVar3;
  float *pfVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImWchar IVar10;
  ImFontGlyph *pIVar11;
  ImFontGlyph *pIVar12;
  ulong uVar13;
  int i;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  float fVar19;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  
  uVar16 = 0;
  for (lVar14 = 0; (ulong)(uint)(this->Glyphs).Size * 0x28 - lVar14 != 0; lVar14 = lVar14 + 0x28) {
    uVar17 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar14) >> 2;
    if (uVar16 <= uVar17) {
      uVar16 = uVar17;
    }
  }
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar16 + 1);
  lVar14 = 4;
  lVar15 = 0;
  while( true ) {
    iVar3 = (this->Glyphs).Size;
    lVar18 = (long)iVar3;
    if (lVar18 <= lVar15) break;
    pIVar11 = (this->Glyphs).Data;
    uVar17 = *(uint *)((long)pIVar11 + lVar14 + -4);
    *(undefined4 *)((long)(this->IndexAdvanceX).Data + (ulong)(uVar17 & 0xfffffffc)) =
         *(undefined4 *)(&pIVar11->field_0x0 + lVar14);
    (this->IndexLookup).Data[uVar17 >> 2] = (unsigned_short)lVar15;
    this->Used4kPagesMap[uVar17 >> 0x11] =
         this->Used4kPagesMap[uVar17 >> 0x11] | (byte)(1 << ((byte)(uVar17 >> 0xe) & 7));
    lVar15 = lVar15 + 1;
    lVar14 = lVar14 + 0x28;
  }
  pIVar11 = FindGlyph(this,0x20);
  if (pIVar11 != (ImFontGlyph *)0x0) {
    pIVar11 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar11[lVar18 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      ImVector<ImFontGlyph>::resize(&this->Glyphs,iVar3 + 1);
      pIVar11 = (this->Glyphs).Data;
      lVar18 = (long)(this->Glyphs).Size;
    }
    pIVar12 = FindGlyph(this,0x20);
    fVar19 = pIVar12->AdvanceX;
    fVar6 = pIVar12->X0;
    fVar7 = pIVar12->Y0;
    fVar8 = pIVar12->X1;
    fVar9 = pIVar12->Y1;
    uVar5 = *(undefined8 *)&pIVar12->U0;
    pIVar2 = pIVar11 + lVar18 + -1;
    *(undefined4 *)&pIVar2->field_0x0 = *(undefined4 *)&pIVar12->field_0x0;
    pIVar2->AdvanceX = fVar19;
    pIVar2->X0 = fVar6;
    pIVar2->Y0 = fVar7;
    pIVar2 = pIVar11 + lVar18 + -1;
    pIVar2->X1 = fVar8;
    pIVar2->Y1 = fVar9;
    *(undefined8 *)(&pIVar2->X1 + 2) = uVar5;
    fVar19 = pIVar12->V1;
    pIVar11[lVar18 + -1].U1 = pIVar12->U1;
    pIVar11[lVar18 + -1].V1 = fVar19;
    *(uint *)(pIVar11 + lVar18 + -1) = *(uint *)(pIVar11 + lVar18 + -1) & 3 | 0x24;
    fVar19 = pIVar11[lVar18 + -1].AdvanceX * 4.0;
    pIVar11[lVar18 + -1].AdvanceX = fVar19;
    (this->IndexAdvanceX).Data[9] = fVar19;
    (this->IndexLookup).Data[*(uint *)(pIVar11 + lVar18 + -1) >> 2] = (short)(this->Glyphs).Size - 1
    ;
  }
  SetGlyphVisible(this,0x20,false);
  SetGlyphVisible(this,9,false);
  ellipsis_chars[0] = 0x2026;
  ellipsis_chars[1] = 0x85;
  dots_chars[0] = 0x2e;
  dots_chars[1] = 0xff0e;
  if (this->EllipsisChar == 0xffff) {
    IVar10 = FindFirstExistingGlyph(this,ellipsis_chars,2);
    this->EllipsisChar = IVar10;
  }
  if (this->DotChar == 0xffff) {
    IVar10 = FindFirstExistingGlyph(this,dots_chars,2);
    this->DotChar = IVar10;
  }
  pIVar11 = FindGlyphNoFallback(this,this->FallbackChar);
  this->FallbackGlyph = pIVar11;
  if (pIVar11 == (ImFontGlyph *)0x0) {
    IVar10 = FindFirstExistingGlyph(this,(ImWchar *)&DAT_002302a2,3);
    this->FallbackChar = IVar10;
    pIVar11 = FindGlyphNoFallback(this,IVar10);
    this->FallbackGlyph = pIVar11;
    if (pIVar11 == (ImFontGlyph *)0x0) {
      pIVar11 = (this->Glyphs).Data + (long)(this->Glyphs).Size + -1;
      this->FallbackGlyph = pIVar11;
      this->FallbackChar = (ImWchar)(*(uint *)pIVar11 >> 2);
    }
  }
  fVar19 = pIVar11->AdvanceX;
  this->FallbackAdvanceX = fVar19;
  for (uVar13 = 0; uVar16 + 1 != uVar13; uVar13 = uVar13 + 1) {
    pfVar4 = (this->IndexAdvanceX).Data;
    pfVar1 = pfVar4 + uVar13;
    if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
      pfVar4[uVar13] = fVar19;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}